

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moremagic.c
# Opt level: O0

void spell_waterbreath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_EDI;
  CHAR_DATA *victim;
  AFFECT_DATA af;
  CHAR_DATA *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  CHAR_DATA *in_stack_ffffffffffffff80;
  
  bVar1 = is_affected(in_RCX,in_EDI);
  if (bVar1) {
    send_to_char((char *)in_stack_ffffffffffffff80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    bVar1 = is_affected(in_RCX,(int)gsn_drowning);
    if (bVar1) {
      act((char *)in_stack_ffffffffffffff80,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_RCX,
          in_stack_ffffffffffffff68,0);
      act((char *)in_stack_ffffffffffffff80,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_RCX,
          in_stack_ffffffffffffff68,0);
      affect_strip(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    init_affect((AFFECT_DATA *)0x6582c8);
    get_spell_aftype(in_stack_ffffffffffffff68);
    std::pow<int,int>(0,0x658335);
    affect_to_char(in_RCX,(AFFECT_DATA *)in_stack_ffffffffffffff68);
    send_to_char((char *)in_stack_ffffffffffffff80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RDX != in_RCX) {
      act((char *)in_stack_ffffffffffffff80,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_RCX,
          in_stack_ffffffffffffff68,0);
    }
  }
  return;
}

Assistant:

void spell_waterbreath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	if (is_affected(victim, sn))
	{
		send_to_char("They can already breathe underwater.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_drowning))
	{
		act("You feel relieved as you begin breathing water like you would air.", victim, 0, 0, TO_CHAR);
		act("$n looks relieved as $e begins breathing water like $e would air.", victim, 0, 0, TO_ROOM);
		affect_strip(victim, gsn_drowning);
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = sn;
	af.aftype = get_spell_aftype(ch);
	af.level = level;
	af.duration = level / 5;
	af.location = 0;
	af.modifier = 0;
	af.end_fun = waterbreath_end;

	SET_BIT(af.bitvector, AFF_WATERBREATH);

	affect_to_char(victim, &af);

	send_to_char("You feel more adept at breathing underwater.\n\r", victim);

	if (ch != victim)
		act("You give $N the ability to breathe underwater.", ch, 0, victim, TO_CHAR);
}